

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jisx0208.h
# Opt level: O0

int jisx0208_wctomb(void *conv,uchar *r,uint wc,int n)

{
  unsigned_short uVar1;
  ushort uVar2;
  byte bVar3;
  unsigned_short c;
  uint i;
  unsigned_short used;
  Summary16 *summary;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  if (n < 2) {
    conv_local._4_4_ = -2;
  }
  else {
    _i = (Summary16 *)0x0;
    if (wc < 0x100) {
      _i = jisx0208_uni2indx_page00 + (wc >> 4);
    }
    else if ((wc < 0x300) || (0x45f < wc)) {
      if ((wc < 0x2000) || (0x231f < wc)) {
        if ((wc < 0x2500) || (0x266f < wc)) {
          if ((wc < 0x3000) || (0x30ff < wc)) {
            if ((wc < 0x4e00) || (0x9faf < wc)) {
              if ((0xfeff < wc) && (wc < 0xfff0)) {
                _i = jisx0208_uni2indx_pageff + ((wc >> 4) - 0xff0);
              }
            }
            else {
              _i = jisx0208_uni2indx_page4e + ((wc >> 4) - 0x4e0);
            }
          }
          else {
            _i = jisx0208_uni2indx_page30 + ((wc >> 4) - 0x300);
          }
        }
        else {
          _i = jisx0208_uni2indx_page25 + ((wc >> 4) - 0x250);
        }
      }
      else {
        _i = jisx0208_uni2indx_page20 + ((wc >> 4) - 0x200);
      }
    }
    else {
      _i = jisx0208_uni2indx_page03 + ((wc >> 4) - 0x30);
    }
    if (_i != (Summary16 *)0x0) {
      bVar3 = (byte)wc & 0xf;
      if (((uint)_i->used & 1 << bVar3) != 0) {
        uVar2 = _i->used & (short)(1 << bVar3) - 1U;
        uVar2 = (uVar2 & 0x5555) + (short)((int)(uVar2 & 0xaaaa) >> 1);
        uVar2 = (uVar2 & 0x3333) + (short)((int)(uVar2 & 0xcccc) >> 2);
        uVar2 = (uVar2 & 0xf0f) + (short)((int)(uVar2 & 0xf0f0) >> 4);
        uVar1 = jisx0208_2charset
                [(int)((uint)_i->indx + (uint)(ushort)((uVar2 & 0xff) + (uVar2 >> 8)))];
        *r = (uchar)(uVar1 >> 8);
        r[1] = (uchar)uVar1;
        return 2;
      }
    }
    conv_local._4_4_ = -1;
  }
  return conv_local._4_4_;
}

Assistant:

static int
jisx0208_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  if (n >= 2) {
    const Summary16 *summary = NULL;
    if (wc < 0x0100)
      summary = &jisx0208_uni2indx_page00[(wc>>4)];
    else if (wc >= 0x0300 && wc < 0x0460)
      summary = &jisx0208_uni2indx_page03[(wc>>4)-0x030];
    else if (wc >= 0x2000 && wc < 0x2320)
      summary = &jisx0208_uni2indx_page20[(wc>>4)-0x200];
    else if (wc >= 0x2500 && wc < 0x2670)
      summary = &jisx0208_uni2indx_page25[(wc>>4)-0x250];
    else if (wc >= 0x3000 && wc < 0x3100)
      summary = &jisx0208_uni2indx_page30[(wc>>4)-0x300];
    else if (wc >= 0x4e00 && wc < 0x9fb0)
      summary = &jisx0208_uni2indx_page4e[(wc>>4)-0x4e0];
    else if (wc >= 0xff00 && wc < 0xfff0)
      summary = &jisx0208_uni2indx_pageff[(wc>>4)-0xff0];
    if (summary) {
      unsigned short used = summary->used;
      unsigned int i = wc & 0x0f;
      if (used & ((unsigned short) 1 << i)) {
        unsigned short c;
        /* Keep in `used' only the bits 0..i-1. */
        used &= ((unsigned short) 1 << i) - 1;
        /* Add `summary->indx' and the number of bits set in `used'. */
        used = (used & 0x5555) + ((used & 0xaaaa) >> 1);
        used = (used & 0x3333) + ((used & 0xcccc) >> 2);
        used = (used & 0x0f0f) + ((used & 0xf0f0) >> 4);
        used = (used & 0x00ff) + (used >> 8);
        c = jisx0208_2charset[summary->indx + used];
        r[0] = (c >> 8); r[1] = (c & 0xff);
        return 2;
      }
    }
    return RET_ILSEQ;
  }
  return RET_TOOSMALL;
}